

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<Header>::removeAt(QList<Header> *this,qsizetype i)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<Header>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<Header> *)0x0);
  }
  QtPrivate::QGenericArrayOps<Header>::erase((QGenericArrayOps<Header> *)this,(this->d).ptr + i,1);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }